

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void movd_PE(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  Int32 IVar3;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp != '\x01') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      (pMyDisasm->Instruction).Category = 0x140001;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      UVar2 = (pMyDisasm->Reserved_).EVEX.W;
    }
    else {
      (pMyDisasm->Instruction).Category = 0x110001;
      UVar2 = (pMyDisasm->Reserved_).REX.W_;
    }
    if (UVar2 == '\0') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovd",6);
      goto LAB_001209a6;
    }
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovq",6);
LAB_00120903:
    IVar3 = 0x68;
  }
  else {
    (pMyDisasm->Instruction).Category = 0x30001;
    if ((pMyDisasm->Prefix).OperandSize != '\x01') {
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        builtin_strncpy(pcVar1,"movq",5);
        IVar3 = 0x68;
      }
      else {
        builtin_strncpy(pcVar1,"movd",5);
        IVar3 = 0x67;
      }
      (pMyDisasm->Reserved_).MemDecoration = IVar3;
      (pMyDisasm->Reserved_).Register_ = 2;
      goto LAB_001209dc;
    }
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      builtin_strncpy(pcVar1,"movq",5);
      goto LAB_00120903;
    }
    builtin_strncpy(pcVar1,"movd",5);
LAB_001209a6:
    IVar3 = 0x67;
  }
  (pMyDisasm->Reserved_).MemDecoration = IVar3;
  (pMyDisasm->Reserved_).Register_ = 4;
LAB_001209dc:
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ movd_PE(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.state == InUsePrefix) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION+DATA_TRANSFER;
        GV.EVEX.tupletype = TUPLE1_SCALAR;
      }
      else {
        pMyDisasm->Instruction.Category = AVX_INSTRUCTION+DATA_TRANSFER;
      }
      if (
        ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
        ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
        ) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovd");
        #endif
        GV.MemDecoration = Arg2dword;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovq");
        #endif
        GV.MemDecoration = Arg2qword;
      }
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    pMyDisasm->Instruction.Category = MMX_INSTRUCTION+DATA_TRANSFER;
     /* ========== 0x66 */
    if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      if (GV.REX.W_ == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
        #endif
        GV.MemDecoration = Arg2qword;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movd");
        #endif
        GV.MemDecoration = Arg2dword;
      }
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
    }
    else {
      if (GV.REX.W_ == 1) {
        GV.MemDecoration = Arg2qword;
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
        #endif
      }
      else {
        GV.MemDecoration = Arg2dword;
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movd");
        #endif
      }
      GV.Register_ = MMX_REG;
      GxEx(pMyDisasm);
    }
  }
}